

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O0

void testEraseAttributeThrowsWithEmptyString(void)

{
  ArgExc *anon_var_0;
  Header header;
  Vec2<float> local_40;
  Header local_38 [56];
  
  Imath_3_2::Vec2<float>::Vec2(&local_40,0.0,0.0);
  Imf_3_4::Header::Header(local_38,0x40,0x40,1.0,(Vec2 *)&local_40,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::erase((char *)local_38);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x4e,"void testEraseAttributeThrowsWithEmptyString()");
}

Assistant:

void
testEraseAttributeThrowsWithEmptyString ()
{
    Header header;

    try
    {
        header.erase ("");
        assert (false);
    }
    catch (const ArgExc&)
    {
        assert (true);
    }
}